

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgument::cmCommandArgument
          (cmCommandArgument *this,cmCommandArgumentsHelper *args,char *key,
          cmCommandArgumentGroup *group)

{
  cmCommandArgument *local_40 [3];
  cmCommandArgumentGroup *local_28;
  cmCommandArgumentGroup *group_local;
  char *key_local;
  cmCommandArgumentsHelper *args_local;
  cmCommandArgument *this_local;
  
  this->_vptr_cmCommandArgument = (_func_int **)&PTR__cmCommandArgument_009d68e0;
  this->Key = key;
  local_28 = group;
  group_local = (cmCommandArgumentGroup *)key;
  key_local = (char *)args;
  args_local = (cmCommandArgumentsHelper *)this;
  std::
  set<const_cmCommandArgument_*,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::set(&this->ArgumentsBefore);
  this->Group = local_28;
  this->WasActive = false;
  this->ArgumentsBeforeEmpty = true;
  this->CurrentIndex = 0;
  if (key_local != (char *)0x0) {
    cmCommandArgumentsHelper::AddArgument((cmCommandArgumentsHelper *)key_local,this);
  }
  if (this->Group != (cmCommandArgumentGroup *)0x0) {
    local_40[0] = this;
    std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::push_back
              (&this->Group->ContainedArguments,local_40);
  }
  return;
}

Assistant:

cmCommandArgument::cmCommandArgument(cmCommandArgumentsHelper* args,
                                     const char* key,
                                     cmCommandArgumentGroup* group)
  : Key(key)
  , Group(group)
  , WasActive(false)
  , ArgumentsBeforeEmpty(true)
  , CurrentIndex(0)
{
  if (args != nullptr) {
    args->AddArgument(this);
  }

  if (this->Group != nullptr) {
    this->Group->ContainedArguments.push_back(this);
  }
}